

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode
N_VScaleAddMultiVectorArray_Serial
          (int nvec,int nsum,sunrealtype *a,N_Vector *X,N_Vector **Y,N_Vector **Z)

{
  N_Vector x;
  long lVar1;
  long lVar2;
  long lVar3;
  N_Vector *Y_00;
  N_Vector *Z_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  x = *X;
  if (nvec == 1) {
    if (nsum == 1) {
      N_VLinearSum_Serial(*a,x,1.0,**Y,**Z);
    }
    else {
      Y_00 = (N_Vector *)malloc((long)nsum << 3);
      Z_00 = (N_Vector *)malloc((long)nsum << 3);
      uVar4 = 0;
      uVar5 = 0;
      if (0 < nsum) {
        uVar5 = (ulong)(uint)nsum;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        Y_00[uVar4] = *Y[uVar4];
        Z_00[uVar4] = *Z[uVar4];
      }
      N_VScaleAddMulti_Serial(nsum,a,x,Y_00,Z_00);
      free(Y_00);
      free(Z_00);
    }
  }
  else if (nsum == 1) {
    N_VLinearSumVectorArray_Serial(nvec,*a,X,1.0,*Y,*Z);
  }
  else {
    uVar5 = 0;
    uVar4 = *x->content;
    if ((long)*x->content < 1) {
      uVar4 = uVar5;
    }
    uVar9 = (ulong)(uint)nsum;
    if (nsum < 1) {
      uVar9 = uVar5;
    }
    if (0 < nvec) {
      uVar5 = (ulong)(uint)nvec;
    }
    uVar6 = 0;
    if (Y == Z) {
      for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        lVar1 = *(long *)((long)X[uVar6]->content + 0x10);
        for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
          lVar2 = *(long *)((long)Y[uVar7][uVar6]->content + 0x10);
          for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
            *(double *)(lVar2 + uVar8 * 8) =
                 a[uVar7] * *(double *)(lVar1 + uVar8 * 8) + *(double *)(lVar2 + uVar8 * 8);
          }
        }
      }
    }
    else {
      for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        lVar1 = *(long *)((long)X[uVar6]->content + 0x10);
        for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
          lVar2 = *(long *)((long)Y[uVar7][uVar6]->content + 0x10);
          lVar3 = *(long *)((long)Z[uVar7][uVar6]->content + 0x10);
          for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
            *(double *)(lVar3 + uVar8 * 8) =
                 a[uVar7] * *(double *)(lVar1 + uVar8 * 8) + *(double *)(lVar2 + uVar8 * 8);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VScaleAddMultiVectorArray_Serial(int nvec, int nsum,
                                              sunrealtype* a, N_Vector* X,
                                              N_Vector** Y, N_Vector** Z)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i, j;
  sunindextype k, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;
  N_Vector* YY;
  N_Vector* ZZ;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1 && nsum >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1)
  {
    /* should have called N_VLinearSum */
    if (nsum == 1)
    {
      N_VLinearSum_Serial(a[0], X[0], ONE, Y[0][0], Z[0][0]);
      SUNCheckLastErr();
      return SUN_SUCCESS;
    }

    /* should have called N_VScaleAddMulti */
    YY = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(YY, SUN_ERR_MALLOC_FAIL);
    ZZ = (N_Vector*)malloc(nsum * sizeof(N_Vector));
    SUNAssert(ZZ, SUN_ERR_MALLOC_FAIL);

    for (j = 0; j < nsum; j++)
    {
      YY[j] = Y[j][0];
      ZZ[j] = Z[j][0];
    }

    SUNCheckCall(N_VScaleAddMulti_Serial(nsum, a, X[0], YY, ZZ));

    free(YY);
    free(ZZ);

    return SUN_SUCCESS;
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 1)
  {
    SUNCheckCall(N_VLinearSumVectorArray_Serial(nvec, a[0], X, ONE, Y[0], Z[0]));
    return SUN_SUCCESS;
  }

  /* ----------------------------
   * Compute multiple linear sums
   * ---------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z)
  {
    for (i = 0; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < nsum; j++)
      {
        yd = NV_DATA_S(Y[j][i]);
        for (k = 0; k < N; k++) { yd[k] += a[j] * xd[k]; }
      }
    }
    return SUN_SUCCESS;
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    for (j = 0; j < nsum; j++)
    {
      yd = NV_DATA_S(Y[j][i]);
      zd = NV_DATA_S(Z[j][i]);
      for (k = 0; k < N; k++) { zd[k] = a[j] * xd[k] + yd[k]; }
    }
  }
  return SUN_SUCCESS;
}